

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O2

int __thiscall QAccessibleTree::childCount(QAccessibleTree *this)

{
  int iVar1;
  int iVar2;
  QObject *object;
  QAbstractItemView *this_00;
  QAbstractItemModel *pQVar3;
  QHeaderView *pQVar4;
  long in_FS_OFFSET;
  QModelIndex QStack_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  object = (QObject *)QAccessibleTable::view(&this->super_QAccessibleTable);
  this_00 = (QAbstractItemView *)QtPrivate::qobject_cast_helper<QTreeView_const*,QObject>(object);
  iVar2 = 0;
  if (this_00 != (QAbstractItemView *)0x0) {
    pQVar3 = QAbstractItemView::model(this_00);
    iVar2 = 0;
    if (pQVar3 != (QAbstractItemModel *)0x0) {
      pQVar4 = QAccessibleTable::horizontalHeader(&this->super_QAccessibleTable);
      iVar1 = *(int *)(*(long *)(this_00 + 8) + 0x5b0);
      QAbstractItemView::rootIndex(&QStack_48,this_00);
      iVar2 = (**(code **)(*(long *)pQVar3 + 0x80))(pQVar3,&QStack_48);
      iVar2 = iVar2 * ((iVar1 + 1) - (uint)(pQVar4 == (QHeaderView *)0x0));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int QAccessibleTree::childCount() const
{
    const QTreeView *treeView = qobject_cast<const QTreeView*>(view());
    if (!treeView)
        return 0;
    const QAbstractItemModel *theModel = treeView->model();
    if (!theModel)
        return 0;

    int hHeader = horizontalHeader() ? 1 : 0;
    return (treeView->d_func()->viewItems.size() + hHeader)
            * theModel->columnCount(treeView->rootIndex());
}